

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O2

void __thiscall
dap::BasicTypeInfo<dap::ColumnDescriptor>::destruct
          (BasicTypeInfo<dap::ColumnDescriptor> *this,void *ptr)

{
  ColumnDescriptor::~ColumnDescriptor((ColumnDescriptor *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }